

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O3

void __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
          (UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this,
          pair<wasm::Expression_*,_wasm::Expression_*> item)

{
  iterator *piVar1;
  _Elt_pointer ppVar2;
  mapped_type *pmVar3;
  undefined1 auStack_20 [8];
  pair<wasm::Expression_*,_wasm::Expression_*> item_local;
  
  item_local.first = item.second;
  auStack_20 = (undefined1  [8])item.first;
  ppVar2 = (this->data).c.
           super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar2 == (this->data).c.
                super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::pair<wasm::Expression*,wasm::Expression*>,std::allocator<std::pair<wasm::Expression*,wasm::Expression*>>>
    ::_M_push_back_aux<std::pair<wasm::Expression*,wasm::Expression*>const&>
              ((deque<std::pair<wasm::Expression*,wasm::Expression*>,std::allocator<std::pair<wasm::Expression*,wasm::Expression*>>>
                *)this,(pair<wasm::Expression_*,_wasm::Expression_*> *)auStack_20);
  }
  else {
    ppVar2->first = (Expression *)auStack_20;
    ppVar2->second = item_local.first;
    piVar1 = &(this->data).c.
              super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pmVar3 = std::__detail::
           _Map_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->count,(key_type *)auStack_20);
  *pmVar3 = *pmVar3 + 1;
  return;
}

Assistant:

void push(T item) {
    data.push(item);
    count[item]++;
  }